

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  qnode_ptr_t p;
  qnode_ptr_t ptVar5;
  t_qnode *ptVar6;
  qnode_ptr_t *flh;
  qnode_ptr_t ptVar7;
  qnode_ptr_t ptVar8;
  int iVar9;
  bool bVar10;
  int local_374;
  int col;
  int row;
  qnode_ptr_t flq;
  qnode_ptr_t im2q;
  double local_358;
  int a;
  int y [2];
  int x [2];
  float div;
  qnode_ptr_t im2h;
  qnode_ptr_t im1q;
  qnode_ptr_t im1h;
  int binary;
  int ssd;
  int iter;
  int nbin;
  int histo;
  int h_type;
  int f_type;
  int pyr;
  int sf;
  int sp;
  int sm;
  int n2;
  int n1;
  float incr;
  float trsh;
  float density;
  float std;
  float avg_err;
  string f2;
  string f1;
  string v_fname;
  uchar hd [32];
  string h_fname;
  string c_fname;
  string i_fname;
  string out_path;
  string in_path;
  
  valid_option(argc,argv,in_path,out_path,&n1,&n2,&local_374,&h_type,&histo,&sm,&sp,&sf,&pyr,&ssd,
               &f_type,&trsh,i_fname,v_fname,c_fname,h_fname,&nbin,&incr,&iter,&binary,&row,&col);
  puts("STAGE 1: Options Validated");
  fflush(_stdout);
  im1h = (qnode_ptr_t)0x0;
  im1q = (qnode_ptr_t)0x0;
  im2h = (qnode_ptr_t)0x0;
  im2q = (qnode_ptr_t)0x0;
  flq = (qnode_ptr_t)0x0;
  kera.k[0] = 1.0;
  kera.k[1] = 5.0;
  kera.k[2] = 8.0;
  kera.k[3] = 5.0;
  kera.k[4] = 1.0;
  kera.f = 20.0;
  kera.m = 5;
  kerb.k[0] = 1.0;
  kerb.k[1] = 5.0;
  kerb.k[2] = 8.0;
  kerb.k[3] = 5.0;
  kerb.k[4] = 1.0;
  kerb.f = 10.0;
  kerb.m = 5;
  filenames(i_fname,n1,n2,f1,f2,&div);
  local_358 = (double)CONCAT44(local_358._4_4_,binary);
  if (binary == 0) {
    raster_size(f1,x,y,&a);
    raster_size(f2,x + 1,y + 1,&a);
    valid_size(x,y);
  }
  else {
    x[0] = col;
    x[1] = col;
    y[0] = row;
    y[1] = row;
    binary_size(col,row,&a);
  }
  puts("STAGE 2: Initializations Completed");
  fflush(_stdout);
  iVar2 = x[0];
  iVar1 = y[0];
  create_pyramid(&im1h,&im1q,local_374,a,x[0],y[0],2);
  iVar3 = x[1];
  iVar9 = y[1];
  create_pyramid(&im2h,&im2q,local_374,a,x[1],y[1],2);
  if (local_358._0_4_ == 0) {
    pgetrast(f1,hd,*im1q->gauss_ptr,iVar2,iVar1,a);
    flh = (qnode_ptr_t *)(ulong)(uint)iVar9;
    pgetrast(f2,hd,*im2q->gauss_ptr,iVar3,iVar9,a);
  }
  else {
    Bpgetrast(f1,*im1q->gauss_ptr,col,row,a);
    flh = (qnode_ptr_t *)(ulong)(uint)a;
    Bpgetrast(f2,*im2q->gauss_ptr,col,row,a);
  }
  puts("STAGE 3: Input Data Read");
  fflush(_stdout);
  if (pyr == 2) {
    cons_lap(im1q);
    cons_lap(im2q);
  }
  else {
    cons_gauss(im1q);
    cons_gauss(im2q);
  }
  puts("STAGE 4: Pyramids Created");
  fflush(_stdout);
  if (ssd == 7) {
    init_beaudet7(&Ix,&Ixx,&Ixy);
  }
  else if (ssd == 5) {
    init_beaudet5(&Ix,&Ixx,&Ixy);
  }
  else if (ssd == 3) {
    init_beaudet3(&Ix,&Ixx,&Ixy);
  }
  iVar1 = local_374 + -1;
  if ((im1h != (qnode_ptr_t)0x0) && (im2h != (qnode_ptr_t)0x0)) {
    local_358 = (double)(ulong)(uint)sm;
    ptVar8 = (qnode_ptr_t)0x0;
    iVar9 = local_374;
    do {
      iVar3 = im1h->res;
      iVar4 = im1h->sizx;
      iVar2 = im1h->sizy;
      local_374 = iVar1;
      p = (qnode_ptr_t)malloc(0x40);
      p->res = iVar3;
      p->sizx = iVar4;
      p->sizy = iVar2;
      p->level = iVar1;
      bVar10 = ptVar8 == (qnode_ptr_t)0x0;
      ptVar6 = ptVar8;
      if (bVar10) {
        ptVar5 = (qnode_ptr_t)0x0;
      }
      else if (ptVar8->level < iVar9) {
        ptVar5 = (qnode_ptr_t)0x0;
        bVar10 = false;
      }
      else {
        do {
          ptVar5 = ptVar6;
          ptVar6 = ptVar5->forth;
          bVar10 = ptVar6 == (t_qnode *)0x0;
          if (bVar10) break;
        } while (iVar9 <= ptVar6->level);
      }
      ptVar7 = p;
      if (ptVar5 != (qnode_ptr_t)0x0) {
        ptVar5->forth = p;
        ptVar7 = ptVar8;
      }
      ptVar8 = p;
      if (!bVar10) {
        ptVar6->back = p;
        ptVar8 = flq;
      }
      flq = ptVar8;
      p->back = ptVar5;
      p->forth = ptVar6;
      alloc_flow(p);
      compute_flow(&im1h,&im1q,&im2h,&im2q,flh,&flq,SUB84(local_358,0),sp,iter);
      iVar1 = local_374 + -1;
    } while ((im1h != (qnode_ptr_t)0x0) &&
            (ptVar8 = ptVar7, iVar9 = local_374, im2h != (qnode_ptr_t)0x0));
  }
  local_374 = iVar1;
  puts("STAGE 5: Flow Estimated");
  fflush(_stdout);
  if (sf != 0) {
    filter(flq,flq,f_type,SUB84((double)trsh,0));
    puts("STAGE 6: Filtering Out Completed");
    fflush(_stdout);
  }
  if (histo == 0) {
    write_velocity(v_fname,flq,SUB84((double)div,0));
    puts("STAGE 8: Flow Field Written to File");
    fflush(_stdout);
    puts("STAGE 9: End of Program\n");
  }
  else {
    local_358 = (double)div;
    prod_histo(flq,c_fname,h_fname,nbin,SUB84((double)incr,0),h_type,&avg_err,&std,&density,
               SUB84(local_358,0));
    puts("STAGE 7: Histograms Produced");
    fflush(_stdout);
    write_velocity(v_fname,flq,SUB84(local_358,0));
    puts("STAGE 8: Flow Field Written to File");
    fflush(_stdout);
    puts("STAGE 9: End of Program\n");
    printf("         Average Angular Error: %10.5f\n",SUB84((double)avg_err,0));
    printf("            Standard Deviation: %10.5f\n",SUB84((double)std,0));
    printf("                       Density: %10.5f\n",SUB84((double)density * 100.0,0));
    fflush(_stdout);
  }
  return 0;
}

Assistant:

int main(argc,argv)
int argc ;
char *argv[] ;

{ qnode_ptr_t create_node(), im1h, im1q, im2h, im2q, flh, flq, fl ;
  unsigned char hd[H] ;
  float trsh, incr, div, avg_err, std, density ;
  int n1, n2, level, sm, sp, sf, pyr, f_type, h_type, histo, nbin, iter, ssd,
  x[N_FRAME], y[N_FRAME], a, binary, row, col ;
  string in_path, out_path, v_fname, i_fname, c_fname, h_fname, f1, f2 ;

  valid_option(argc,argv,in_path,out_path,&n1,&n2,&level,&h_type,&histo,&sm,
               &sp,&sf,&pyr,&ssd,&f_type,&trsh,i_fname,v_fname,c_fname,h_fname,
               &nbin,&incr,&iter,&binary,&row,&col) ;
  printf("STAGE 1: Options Validated\n") ; fflush(stdout) ;
  init_list(&im1h,&im1q) ;
  init_list(&im2h,&im2q) ;
  init_list(&flh,&flq) ;
  init_kernel_a(&kera) ;
  init_kernel_b(&kerb) ;
  filenames(i_fname,n1,n2,f1,f2,&div) ;
  if (!binary) {
    raster_size(f1,&(x[0]),&(y[0]),&a) ;
    raster_size(f2,&(x[1]),&(y[1]),&a) ;
    valid_size(x,y) ;
  }
  else {
    x[0] = col ; x[1] = col ;
    y[0] = row ; y[1] = row ;
    binary_size(col,row,&a) ;
  }
  printf("STAGE 2: Initializations Completed\n") ; fflush(stdout) ;
  create_pyramid(&im1h,&im1q,level,a,x[0],y[0],2) ;
  create_pyramid(&im2h,&im2q,level,a,x[1],y[1],2) ;
  if (!binary) {
    pgetrast(f1,hd,im1q->gauss_ptr,x[0],y[0],a) ;
    pgetrast(f2,hd,im2q->gauss_ptr,x[1],y[1],a) ;
  }
  else {
    Bpgetrast(f1,im1q->gauss_ptr,col,row,a) ;
    Bpgetrast(f2,im2q->gauss_ptr,col,row,a) ;
  }
  printf("STAGE 3: Input Data Read\n") ; fflush(stdout) ;
  if (pyr == LAP) {
    cons_lap(im1q) ;
    cons_lap(im2q) ;
  }
  else {
    cons_gauss(im1q) ;
    cons_gauss(im2q) ;
  }
  printf("STAGE 4: Pyramids Created\n") ; fflush(stdout) ;
  if (ssd == 3) {
    init_beaudet3(&Ix,&Ixx,&Ixy) ;
  }
  else {
    if (ssd == 5) {
      init_beaudet5(&Ix,&Ixx,&Ixy) ;
    }
    else {
      if (ssd == 7) {
        init_beaudet7(&Ix,&Ixx,&Ixy) ;
      }
    }
  }
  level -= 1 ;
  while ((im1h != (qnode_ptr_t)NULL) && (im2h != (qnode_ptr_t)NULL)) {
    fl = create_node(level,im1h->res,im1h->sizx,im1h->sizy) ;
    insert_node(fl,&flh,&flq) ;
    alloc_flow(fl) ;
    compute_flow(&im1h,&im1q,&im2h,&im2q,&flh,&flq,sm,sp,iter) ;
    level-- ;
  }
  printf("STAGE 5: Flow Estimated\n") ; fflush(stdout) ;
  if (sf) {
    filter(flq,flq,f_type,trsh) ;
    printf("STAGE 6: Filtering Out Completed\n") ; fflush(stdout) ;
  }
  if (histo) {
    prod_histo(flq,c_fname,h_fname,nbin,incr,h_type,&avg_err,&std,&density,div) ;
    printf("STAGE 7: Histograms Produced\n") ; fflush(stdout) ;
  }
  dump_flow(&flh,&flq,v_fname,div) ;
  printf("STAGE 8: Flow Field Written to File\n") ; fflush(stdout) ;
  printf("STAGE 9: End of Program\n\n") ;
  if (histo) {
    printf("         Average Angular Error: %10.5f\n", avg_err) ;
    printf("            Standard Deviation: %10.5f\n", std) ;
    printf("                       Density: %10.5f\n", density*100.0) ;
    fflush(stdout) ;
  }
}